

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

bool __thiscall
glslang::TIoMapper::addStage
          (TIoMapper *this,EShLanguage stage,TIntermediate *intermediate,TInfoSink *infoSink,
          TIoMapResolver *resolver)

{
  TDestinationStack *this_00;
  TIntermNode *pTVar1;
  char *__s;
  _List_node_base *p_Var2;
  pointer pTVar3;
  pointer pTVar4;
  _Base_ptr p_Var5;
  key_type *pkVar6;
  iterator iVar7;
  ulong uVar8;
  long lVar9;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *ppVar10;
  byte bVar11;
  TVarLivePair *var;
  __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
  __i;
  TDefaultIoResolver *pTVar12;
  long lVar13;
  pointer pTVar14;
  byte bVar15;
  TNotifyUniformAdaptor TVar16;
  TNotifyInOutAdaptor __f;
  TNotifyInOutAdaptor __f_00;
  bool hadError;
  EShLanguage local_5cc;
  TVarLiveVector uniformVector;
  TVarLiveVector outVector;
  TVarLiveVector inVector;
  TVarLiveMap outVarMap;
  TVarLiveMap uniformVarMap;
  TVarLiveMap inVarMap;
  TResolverInOutAdaptor inOutResolve;
  TVarSetTraverser iter_iomap;
  TVarGatherTraverser iter_binding_live;
  TVarGatherTraverser iter_binding_all;
  TDefaultHlslIoResolver defaultHlslResolver;
  TDefaultIoResolver defaultResolver;
  
  bVar15 = 1;
  if (((intermediate->resourceSetBinding).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (intermediate->resourceSetBinding).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (intermediate->autoMapBindings == false)) {
    bVar15 = intermediate->autoMapLocations;
  }
  lVar9 = 0x3c0;
  uVar8 = 0;
  while ((uVar8 < 6 && ((bVar15 & 1) == 0))) {
    bVar15 = true;
    if ((intermediate->shiftBinding)._M_elems[uVar8] == 0) {
      bVar15 = *(long *)((long)&intermediate->language + lVar9) != 0;
    }
    uVar8 = uVar8 + 1;
    lVar9 = lVar9 + 0x30;
  }
  bVar11 = 1;
  if (resolver != (TIoMapResolver *)0x0 || (bVar15 & 1) != 0) {
    if (((intermediate->numEntryPoints == 1) && (intermediate->recursive == false)) &&
       (pTVar1 = intermediate->treeRoot, pTVar1 != (TIntermNode *)0x0)) {
      TDefaultIoResolver::TDefaultIoResolver(&defaultResolver,intermediate);
      TDefaultHlslIoResolver::TDefaultHlslIoResolver(&defaultHlslResolver,intermediate);
      pTVar12 = &defaultResolver;
      if ((intermediate->hlslIoMapping & 1U) != 0) {
        pTVar12 = (TDefaultIoResolver *)&defaultHlslResolver;
      }
      if (resolver != (TIoMapResolver *)0x0) {
        pTVar12 = (TDefaultIoResolver *)resolver;
      }
      (*(pTVar12->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver[0x14])
                (pTVar12,(ulong)stage,intermediate);
      inVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &inVarMap._M_t._M_impl.super__Rb_tree_header._M_header;
      inVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      inVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      inVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      outVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &outVarMap._M_t._M_impl.super__Rb_tree_header._M_header;
      outVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      outVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      outVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_header;
      uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      inVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      inVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      inVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      outVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      outVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      outVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uniformVector.
      super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      uniformVector.
      super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uniformVector.
      super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      outVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           outVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      inVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           inVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      TVarGatherTraverser::TVarGatherTraverser
                (&iter_binding_all,intermediate,true,&inVarMap,&outVarMap,&uniformVarMap);
      TVarGatherTraverser::TVarGatherTraverser
                (&iter_binding_live,intermediate,false,&inVarMap,&outVarMap,&uniformVarMap);
      (*pTVar1->_vptr_TIntermNode[2])(pTVar1,&iter_binding_all);
      __s = (intermediate->entryPointMangledName)._M_dataplus._M_p;
      inOutResolve._0_8_ = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &iter_iomap,__s,(pool_allocator<char> *)&inOutResolve);
      TLiveTraverser::pushFunction(&iter_binding_live.super_TLiveTraverser,(TString *)&iter_iomap);
      this_00 = &iter_binding_live.super_TLiveTraverser.destinations;
      while (iter_binding_live.super_TLiveTraverser.destinations.
             super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
             ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this_00) {
        p_Var2 = iter_binding_live.super_TLiveTraverser.destinations.
                 super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                 ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
        std::__cxx11::
        list<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>::pop_back
                  (this_00);
        (*(code *)p_Var2->_M_next[1]._M_next)(p_Var2,&iter_binding_live);
      }
      for (p_Var5 = inVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pTVar4 = inVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          pTVar3 = inVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          (_Rb_tree_header *)p_Var5 != &inVarMap._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        TVarLivePair::TVarLivePair
                  ((TVarLivePair *)&iter_iomap,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                    *)(p_Var5 + 1));
        std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::
        emplace_back<glslang::TVarLivePair>(&inVector,(TVarLivePair *)&iter_iomap);
      }
      if (inVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          inVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar13 = (long)inVector.
                       super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)inVector.
                       super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = lVar13 / 0x58;
        lVar9 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__0>>
                  (inVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   inVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar13 < 0x581) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__0>>
                    (pTVar3,pTVar4);
        }
        else {
          pTVar14 = pTVar3 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__0>>
                    (pTVar3,pTVar14);
          for (; pTVar14 != pTVar4; pTVar14 = pTVar14 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__0>>
                      (pTVar14);
          }
        }
      }
      for (p_Var5 = outVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pTVar4 = outVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          pTVar3 = outVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          (_Rb_tree_header *)p_Var5 != &outVarMap._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        TVarLivePair::TVarLivePair
                  ((TVarLivePair *)&iter_iomap,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                    *)(p_Var5 + 1));
        std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::
        emplace_back<glslang::TVarLivePair>(&outVector,(TVarLivePair *)&iter_iomap);
      }
      if (outVector.
          super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
          super__Vector_impl_data._M_start !=
          outVector.
          super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar13 = (long)outVector.
                       super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)outVector.
                       super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = lVar13 / 0x58;
        lVar9 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__1>>
                  (outVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   outVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar13 < 0x581) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__1>>
                    (pTVar3,pTVar4);
        }
        else {
          pTVar14 = pTVar3 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__1>>
                    (pTVar3,pTVar14);
          for (; pTVar14 != pTVar4; pTVar14 = pTVar14 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__1>>
                      (pTVar14);
          }
        }
      }
      for (p_Var5 = uniformVarMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pTVar4 = uniformVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          pTVar3 = uniformVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          (_Rb_tree_header *)p_Var5 != &uniformVarMap._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        TVarLivePair::TVarLivePair
                  ((TVarLivePair *)&iter_iomap,
                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                    *)(p_Var5 + 1));
        std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::
        emplace_back<glslang::TVarLivePair>(&uniformVector,(TVarLivePair *)&iter_iomap);
      }
      if (uniformVector.
          super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
          super__Vector_impl_data._M_start !=
          uniformVector.
          super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar13 = (long)uniformVector.
                       super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)uniformVector.
                       super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = lVar13 / 0x58;
        lVar9 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__2>>
                  (uniformVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   uniformVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar13 < 0x581) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__2>>
                    (pTVar3,pTVar4);
        }
        else {
          pTVar14 = pTVar3 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__2>>
                    (pTVar3,pTVar14);
          for (; pTVar14 != pTVar4; pTVar14 = pTVar14 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TIoMapper::addStage(EShLanguage,glslang::TIntermediate&,TInfoSink&,glslang::TIoMapResolver*)::__2>>
                      (pTVar14);
          }
        }
      }
      inOutResolve.error = &hadError;
      hadError = false;
      inOutResolve.stage = stage;
      inOutResolve.resolver = (TIoMapResolver *)pTVar12;
      inOutResolve.infoSink = infoSink;
      (*(pTVar12->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver[0xc])
                (pTVar12,(ulong)stage);
      __f._4_4_ = 0;
      __f.stage = stage;
      __f.resolver = (TIoMapResolver *)pTVar12;
      std::
      for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TNotifyInOutAdaptor>
                ((__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                  )inVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                  )inVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__f);
      __f_00._4_4_ = 0;
      __f_00.stage = stage;
      __f_00.resolver = (TIoMapResolver *)pTVar12;
      std::
      for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TNotifyInOutAdaptor>
                ((__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                  )outVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                  )outVector.
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__f_00);
      TVar16._4_4_ = 0;
      TVar16.stage = stage;
      TVar16.resolver = (TIoMapResolver *)pTVar12;
      TVar16 = std::
               for_each<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,glslang::TNotifyUniformAdaptor>
                         ((__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                           )uniformVector.
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (__normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
                           )uniformVector.
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_finish,TVar16);
      (*(pTVar12->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver[0xd])
                (pTVar12,(ulong)stage,TVar16.resolver);
      (*(pTVar12->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver[0xe])
                (pTVar12,(ulong)stage);
      pTVar3 = inVector.
               super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (ppVar10 = &(inVector.
                       super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ; pTVar4 = inVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
          ppVar10 !=
          &pTVar3->
           super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ; ppVar10 = ppVar10 + 1) {
        TResolverInOutAdaptor::operator()(&inOutResolve,ppVar10);
      }
      local_5cc = stage;
      for (ppVar10 = &(inVector.
                       super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ; pTVar3 = outVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
          ppVar10 !=
          &pTVar4->
           super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ; ppVar10 = ppVar10 + 1) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                *)&iter_iomap,ppVar10);
        pkVar6 = (key_type *)
                 (*(code *)(*iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
                             super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                             super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)[0xd].
                           _vptr_TIntermNode)();
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                ::find(&inVarMap._M_t,pkVar6);
        if (((_Rb_tree_header *)iVar7._M_node != &inVarMap._M_t._M_impl.super__Rb_tree_header) &&
           ((_Base_ptr)
            iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
            super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
            super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish == iVar7._M_node[2]._M_parent)) {
          iVar7._M_node[3]._M_parent =
               (_Base_ptr)
               iter_iomap.super_TLiveTraverser.destinations.
               super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
               ._M_impl._M_node._M_size;
          iVar7._M_node[3]._M_left = (_Base_ptr)iter_iomap.super_TLiveTraverser.intermediate;
          iVar7._M_node[2]._M_right =
               (_Base_ptr)
               iter_iomap.super_TLiveTraverser.destinations.
               super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
               ._M_impl._M_node.super__List_node_base._M_next;
          *(_List_node_base **)(iVar7._M_node + 3) =
               iter_iomap.super_TLiveTraverser.destinations.
               super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
          iVar7._M_node[2]._M_parent =
               (_Base_ptr)
               iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
               super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          iVar7._M_node[2]._M_left =
               (_Base_ptr)
               iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
               super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
      }
      for (ppVar10 = &(outVector.
                       super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ; pTVar4 = outVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
          ppVar10 !=
          &pTVar3->
           super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ; ppVar10 = ppVar10 + 1) {
        TResolverInOutAdaptor::operator()(&inOutResolve,ppVar10);
      }
      for (ppVar10 = &(outVector.
                       super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ; pTVar3 = uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
          ppVar10 !=
          &pTVar4->
           super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ; ppVar10 = ppVar10 + 1) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                *)&iter_iomap,ppVar10);
        pkVar6 = (key_type *)
                 (*(code *)(*iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
                             super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                             super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)[0xd].
                           _vptr_TIntermNode)();
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                ::find(&outVarMap._M_t,pkVar6);
        if (((_Rb_tree_header *)iVar7._M_node != &outVarMap._M_t._M_impl.super__Rb_tree_header) &&
           ((_Base_ptr)
            iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
            super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
            super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish == iVar7._M_node[2]._M_parent)) {
          iVar7._M_node[3]._M_parent =
               (_Base_ptr)
               iter_iomap.super_TLiveTraverser.destinations.
               super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
               ._M_impl._M_node._M_size;
          iVar7._M_node[3]._M_left = (_Base_ptr)iter_iomap.super_TLiveTraverser.intermediate;
          iVar7._M_node[2]._M_right =
               (_Base_ptr)
               iter_iomap.super_TLiveTraverser.destinations.
               super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
               ._M_impl._M_node.super__List_node_base._M_next;
          *(_List_node_base **)(iVar7._M_node + 3) =
               iter_iomap.super_TLiveTraverser.destinations.
               super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
          iVar7._M_node[2]._M_parent =
               (_Base_ptr)
               iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
               super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          iVar7._M_node[2]._M_left =
               (_Base_ptr)
               iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
               super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
      }
      iter_iomap.super_TLiveTraverser.liveFunctions._M_h._M_rehash_policy._M_next_resize = 0;
      iter_iomap.super_TLiveTraverser.liveFunctions._M_h._M_single_bucket = (__node_base_ptr)0x0;
      iter_iomap.super_TLiveTraverser.liveFunctions._M_h._M_element_count = 0;
      iter_iomap.super_TLiveTraverser.liveFunctions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      iter_iomap.super_TLiveTraverser.liveFunctions._M_h._M_rehash_policy._4_4_ = 0;
      iter_iomap.super_TLiveTraverser.liveFunctions._M_h._M_bucket_count = 0;
      iter_iomap.super_TLiveTraverser.liveFunctions._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)0x0;
      iter_iomap.super_TLiveTraverser.intermediate = (TIntermediate *)0x0;
      iter_iomap.super_TLiveTraverser.liveFunctions._M_h._M_buckets = (__buckets_ptr)0x0;
      iter_iomap.super_TLiveTraverser.destinations.
      super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      iter_iomap.super_TLiveTraverser.destinations.
      super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
      _M_impl._M_node._M_size = 0;
      iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
      super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
      super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iter_iomap.super_TLiveTraverser.destinations.
      super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
      super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
      super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
      super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
      super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      iter_iomap.super_TLiveTraverser.super_TIntermTraverser._vptr_TIntermTraverser._0_4_ =
           local_5cc;
      iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
      super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
      super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
      super__Tp_alloc_type.allocator = (TPoolAllocator *)&hadError;
      iter_iomap.super_TLiveTraverser.super_TIntermTraverser._8_8_ = pTVar12;
      iter_iomap.super_TLiveTraverser.super_TIntermTraverser._16_8_ = infoSink;
      for (ppVar10 = &(uniformVector.
                       super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ; pTVar4 = uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
          ppVar10 !=
          &pTVar3->
           super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ; ppVar10 = ppVar10 + 1) {
        TResolverUniformAdaptor::operator()((TResolverUniformAdaptor *)&iter_iomap,ppVar10);
      }
      for (ppVar10 = &(uniformVector.
                       super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ; ppVar10 !=
            &pTVar4->
             super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
          ; ppVar10 = ppVar10 + 1) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                *)&iter_iomap,ppVar10);
        pkVar6 = (key_type *)
                 (*(code *)(*iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
                             super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                             super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)[0xd].
                           _vptr_TIntermNode)();
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                ::find(&uniformVarMap._M_t,pkVar6);
        if (((_Rb_tree_header *)iVar7._M_node != &uniformVarMap._M_t._M_impl.super__Rb_tree_header)
           && ((_Base_ptr)
               iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
               super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish == iVar7._M_node[2]._M_parent)) {
          iVar7._M_node[3]._M_parent =
               (_Base_ptr)
               iter_iomap.super_TLiveTraverser.destinations.
               super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
               ._M_impl._M_node._M_size;
          iVar7._M_node[3]._M_left = (_Base_ptr)iter_iomap.super_TLiveTraverser.intermediate;
          iVar7._M_node[2]._M_right =
               (_Base_ptr)
               iter_iomap.super_TLiveTraverser.destinations.
               super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
               ._M_impl._M_node.super__List_node_base._M_next;
          *(_List_node_base **)(iVar7._M_node + 3) =
               iter_iomap.super_TLiveTraverser.destinations.
               super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
          iVar7._M_node[2]._M_parent =
               (_Base_ptr)
               iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
               super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          iVar7._M_node[2]._M_left =
               (_Base_ptr)
               iter_iomap.super_TLiveTraverser.super_TIntermTraverser.path.
               super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
               super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
      }
      (*(pTVar12->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver[0xf])
                (pTVar12,(ulong)local_5cc);
      if (hadError == false) {
        TVarSetTraverser::TVarSetTraverser
                  (&iter_iomap,intermediate,&inVarMap,&outVarMap,&uniformVarMap);
        (*pTVar1->_vptr_TIntermNode[2])(pTVar1,&iter_iomap);
        TLiveTraverser::~TLiveTraverser(&iter_iomap.super_TLiveTraverser);
        bVar11 = hadError ^ 1;
      }
      else {
        bVar11 = 0;
      }
      TLiveTraverser::~TLiveTraverser(&iter_binding_live.super_TLiveTraverser);
      TLiveTraverser::~TLiveTraverser(&iter_binding_all.super_TLiveTraverser);
      std::_Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::
      ~_Vector_base(&uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   );
      std::_Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::
      ~_Vector_base(&outVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   );
      std::_Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::
      ~_Vector_base(&inVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   );
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
      ::~_Rb_tree(&uniformVarMap._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
      ::~_Rb_tree(&outVarMap._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
      ::~_Rb_tree(&inVarMap._M_t);
      TDefaultIoResolverBase::~TDefaultIoResolverBase
                (&defaultHlslResolver.super_TDefaultIoResolverBase);
      TDefaultIoResolverBase::~TDefaultIoResolverBase(&defaultResolver.super_TDefaultIoResolverBase)
      ;
    }
    else {
      bVar11 = 0;
    }
  }
  return (bool)(bVar11 & 1);
}

Assistant:

bool TIoMapper::addStage(EShLanguage stage, TIntermediate& intermediate, TInfoSink& infoSink, TIoMapResolver* resolver) {
    bool somethingToDo = ! intermediate.getResourceSetBinding().empty() || intermediate.getAutoMapBindings() ||
                         intermediate.getAutoMapLocations();
    // Restrict the stricter condition to further check 'somethingToDo' only if 'somethingToDo' has not been set, reduce
    // unnecessary or insignificant for-loop operation after 'somethingToDo' have been true.
    for (int res = 0; (res < EResCount && !somethingToDo); ++res) {
        somethingToDo = somethingToDo || (intermediate.getShiftBinding(TResourceType(res)) != 0) ||
                        intermediate.hasShiftBindingForSet(TResourceType(res));
    }
    if (! somethingToDo && resolver == nullptr)
        return true;
    if (intermediate.getNumEntryPoints() != 1 || intermediate.isRecursive())
        return false;
    TIntermNode* root = intermediate.getTreeRoot();
    if (root == nullptr)
        return false;
    // if no resolver is provided, use the default resolver with the given shifts and auto map settings
    TDefaultIoResolver defaultResolver(intermediate);
#ifdef ENABLE_HLSL
    TDefaultHlslIoResolver defaultHlslResolver(intermediate);
    if (resolver == nullptr) {
        // TODO: use a passed in IO mapper for this
        if (intermediate.usingHlslIoMapping())
            resolver = &defaultHlslResolver;
        else
            resolver = &defaultResolver;
    }
#else
    resolver = &defaultResolver;
#endif
    resolver->addStage(stage, intermediate);

    TVarLiveMap inVarMap, outVarMap, uniformVarMap;
    TVarLiveVector inVector, outVector, uniformVector;
    TVarGatherTraverser iter_binding_all(intermediate, true, inVarMap, outVarMap, uniformVarMap);
    TVarGatherTraverser iter_binding_live(intermediate, false, inVarMap, outVarMap, uniformVarMap);
    root->traverse(&iter_binding_all);
    iter_binding_live.pushFunction(intermediate.getEntryPointMangledName().c_str());
    while (! iter_binding_live.destinations.empty()) {
        TIntermNode* destination = iter_binding_live.destinations.back();
        iter_binding_live.destinations.pop_back();
        destination->traverse(&iter_binding_live);
    }

    // sort entries by priority. see TVarEntryInfo::TOrderByPriority for info.
    for (auto& var : inVarMap) { inVector.push_back(var); }
    std::sort(inVector.begin(), inVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
        return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
    });
    for (auto& var : outVarMap) { outVector.push_back(var); }
    std::sort(outVector.begin(), outVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
        return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
    });
    for (auto& var : uniformVarMap) { uniformVector.push_back(var); }
    std::sort(uniformVector.begin(), uniformVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
        return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
    });
    bool hadError = false;
    TVarLiveMap* dummyUniformVarMap[EShLangCount] = {};
    TNotifyInOutAdaptor inOutNotify(stage, *resolver);
    TNotifyUniformAdaptor uniformNotify(stage, *resolver);
    TResolverUniformAdaptor uniformResolve(stage, *resolver, dummyUniformVarMap, infoSink, hadError);
    TResolverInOutAdaptor inOutResolve(stage, *resolver, infoSink, hadError);
    resolver->beginNotifications(stage);
    std::for_each(inVector.begin(), inVector.end(), inOutNotify);
    std::for_each(outVector.begin(), outVector.end(), inOutNotify);
    std::for_each(uniformVector.begin(), uniformVector.end(), uniformNotify);
    resolver->endNotifications(stage);
    resolver->beginResolve(stage);
    for (auto& var : inVector) { inOutResolve(var); }
    std::for_each(inVector.begin(), inVector.end(), [&inVarMap](TVarLivePair p) {
        auto at = inVarMap.find(p.second.symbol->getAccessName());
        if (at != inVarMap.end() && p.second.id == at->second.id)
            at->second = p.second;
    });
    for (auto& var : outVector) { inOutResolve(var); }
    std::for_each(outVector.begin(), outVector.end(), [&outVarMap](TVarLivePair p) {
        auto at = outVarMap.find(p.second.symbol->getAccessName());
        if (at != outVarMap.end() && p.second.id == at->second.id)
            at->second = p.second;
    });
    std::for_each(uniformVector.begin(), uniformVector.end(), uniformResolve);
    std::for_each(uniformVector.begin(), uniformVector.end(), [&uniformVarMap](TVarLivePair p) {
        auto at = uniformVarMap.find(p.second.symbol->getAccessName());
        if (at != uniformVarMap.end() && p.second.id == at->second.id)
            at->second = p.second;
    });
    resolver->endResolve(stage);
    if (!hadError) {
        TVarSetTraverser iter_iomap(intermediate, inVarMap, outVarMap, uniformVarMap);
        root->traverse(&iter_iomap);
    }
    return !hadError;
}